

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallFileGenerator::SetImportLocationProperty
          (cmExportInstallFileGenerator *this,string *config,string *suffix,
          cmInstallTargetGenerator *itgen,ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations)

{
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *target_00;
  char *in_name;
  cmGeneratorTarget *this_00;
  reference pbVar3;
  mapped_type *pmVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  string local_210;
  string local_1f0;
  string local_1d0;
  allocator local_1a9;
  undefined1 local_1a8 [8];
  string prop_2;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  undefined1 local_108 [8];
  string prop_1;
  string local_d8;
  allocator local_b1;
  undefined1 local_b0 [8];
  string prop;
  undefined1 local_80 [8];
  string value;
  string dest;
  cmGeneratorTarget *target;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *importedLocations_local;
  ImportPropertyMap *properties_local;
  cmInstallTargetGenerator *itgen_local;
  string *suffix_local;
  string *config_local;
  cmExportInstallFileGenerator *this_local;
  
  if ((itgen != (cmInstallTargetGenerator *)0x0) &&
     (bVar1 = cmInstallGenerator::InstallsForConfig(&itgen->super_cmInstallGenerator,config), bVar1)
     ) {
    target_00 = cmInstallTargetGenerator::GetTarget(itgen);
    cmInstallTargetGenerator::GetDestination((string *)((long)&value.field_2 + 8),itgen,config);
    std::__cxx11::string::string((string *)local_80);
    in_name = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (!bVar1) {
      std::__cxx11::string::operator=((string *)local_80,"${_IMPORT_PREFIX}/");
    }
    std::__cxx11::string::operator+=((string *)local_80,(string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_80,"/");
    bVar1 = cmInstallTargetGenerator::IsImportLibrary(itgen);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_b0,"IMPORTED_IMPLIB",&local_b1);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      std::__cxx11::string::operator+=((string *)local_b0,(string *)suffix);
      cmInstallTargetGenerator::GetInstallFilename(&local_d8,target_00,config,NameImplib);
      std::__cxx11::string::operator+=((string *)local_80,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,(key_type *)local_b0);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)local_80);
      pVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(importedLocations,(value_type *)local_b0);
      prop_1.field_2._8_8_ = pVar5.first._M_node;
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      this_00 = cmInstallTargetGenerator::GetTarget(itgen);
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (TVar2 == OBJECT_LIBRARY) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_108,"IMPORTED_OBJECTS",
                   (allocator *)
                   ((long)&objects.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&objects.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::operator+=((string *)local_108,(string *)suffix);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
        cmInstallTargetGenerator::GetInstallObjectNames
                  (itgen,config,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i);
        local_130._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
        while( true ) {
          local_138._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
          bVar1 = __gnu_cxx::operator!=(&local_130,&local_138);
          if (!bVar1) break;
          pbVar3 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_130);
          std::operator+(&local_158,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,pbVar3);
          pbVar3 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_130);
          std::__cxx11::string::operator=((string *)pbVar3,(string *)&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_130);
        }
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_178,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i,";");
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,(key_type *)local_108);
        std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        pVar5 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(importedLocations,(value_type *)local_108);
        prop_2.field_2._8_8_ = pVar5.first._M_node;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i);
        std::__cxx11::string::~string((string *)local_108);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_1a8,"IMPORTED_LOCATION",&local_1a9);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
        std::__cxx11::string::operator+=((string *)local_1a8,(string *)suffix);
        bVar1 = cmGeneratorTarget::IsAppBundleOnApple(target_00);
        if (bVar1) {
          cmInstallTargetGenerator::GetInstallFilename(&local_1d0,target_00,config,NameNormal);
          std::__cxx11::string::operator+=((string *)local_80,(string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::operator+=((string *)local_80,".app/Contents/MacOS/");
          cmInstallTargetGenerator::GetInstallFilename(&local_1f0,target_00,config,NameNormal);
          std::__cxx11::string::operator+=((string *)local_80,(string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
        }
        else {
          cmInstallTargetGenerator::GetInstallFilename(&local_210,target_00,config,NameReal);
          std::__cxx11::string::operator+=((string *)local_80,(string *)&local_210);
          std::__cxx11::string::~string((string *)&local_210);
        }
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,(key_type *)local_1a8);
        std::__cxx11::string::operator=((string *)pmVar4,(string *)local_80);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(importedLocations,(value_type *)local_1a8);
        std::__cxx11::string::~string((string *)local_1a8);
      }
    }
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmInstallTargetGenerator* itgen, ImportPropertyMap& properties,
  std::set<std::string>& importedLocations)
{
  // Skip rules that do not match this configuration.
  if (!(itgen && itgen->InstallsForConfig(config))) {
    return;
  }

  // Get the target to be installed.
  cmGeneratorTarget* target = itgen->GetTarget();

  // Construct the installed location of the target.
  std::string dest = itgen->GetDestination(config);
  std::string value;
  if (!cmSystemTools::FileIsFullPath(dest.c_str())) {
    // The target is installed relative to the installation prefix.
    value = "${_IMPORT_PREFIX}/";
  }
  value += dest;
  value += "/";

  if (itgen->IsImportLibrary()) {
    // Construct the property name.
    std::string prop = "IMPORTED_IMPLIB";
    prop += suffix;

    // Append the installed file name.
    value += itgen->GetInstallFilename(target, config,
                                       cmInstallTargetGenerator::NameImplib);

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  } else if (itgen->GetTarget()->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // Construct the property name.
    std::string prop = "IMPORTED_OBJECTS";
    prop += suffix;

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<std::string> objects;
    itgen->GetInstallObjectNames(config, objects);
    for (std::vector<std::string>::iterator i = objects.begin();
         i != objects.end(); ++i) {
      *i = value + *i;
    }

    // Store the property.
    properties[prop] = cmJoin(objects, ";");
    importedLocations.insert(prop);
  } else {
    // Construct the property name.
    std::string prop = "IMPORTED_LOCATION";
    prop += suffix;

    // Append the installed file name.
    if (target->IsAppBundleOnApple()) {
      value += itgen->GetInstallFilename(target, config);
      value += ".app/Contents/MacOS/";
      value += itgen->GetInstallFilename(target, config);
    } else {
      value += itgen->GetInstallFilename(target, config,
                                         cmInstallTargetGenerator::NameReal);
    }

    // Store the property.
    properties[prop] = value;
    importedLocations.insert(prop);
  }
}